

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O2

void __thiscall
ObjTable<QPDFWriter::Object>::forEach
          (ObjTable<QPDFWriter::Object> *this,function<void_(int,_const_QPDFWriter::Object_&)> *fn)

{
  pointer pOVar1;
  int iVar2;
  ObjTable<QPDFWriter::Object> *__range2;
  Object *item;
  pointer __args_1;
  _Base_ptr p_Var3;
  
  pOVar1 = (this->super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>).
           super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar2 = 0;
  for (__args_1 = (this->super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>).
                  super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                  _M_impl.super__Vector_impl_data._M_start; __args_1 != pOVar1;
      __args_1 = __args_1 + 1) {
    std::function<void_(int,_const_QPDFWriter::Object_&)>::operator()(fn,iVar2,__args_1);
    iVar2 = iVar2 + 1;
  }
  for (p_Var3 = (this->sparse_elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->sparse_elements)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    iVar2 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert
                      ((unsigned_long *)(p_Var3 + 1));
    std::function<void_(int,_const_QPDFWriter::Object_&)>::operator()
              (fn,iVar2,(Object *)&p_Var3[1]._M_parent);
  }
  return;
}

Assistant:

inline void
    forEach(std::function<void(int, const T&)> fn)
    {
        int i = 0;
        for (auto const& item: *this) {
            fn(i++, item);
        }
        for (auto const& [id, item]: sparse_elements) {
            fn(QIntC::to_int(id), item);
        }
    }